

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.cpp
# Opt level: O2

void __thiscall Pathie::Tempfile::~Tempfile(Tempfile *this)

{
  char *in_RSI;
  
  (this->super_TempEntry)._vptr_TempEntry = (_func_int **)&PTR__Tempfile_00114ce0;
  if ((this->super_TempEntry).m_keep == false) {
    remove(this,in_RSI);
  }
  TempEntry::~TempEntry(&this->super_TempEntry);
  return;
}

Assistant:

Tempfile::~Tempfile()
{
  if (!m_keep)
    remove();
}